

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_create_all_obj_from_tval(command *cmd)

{
  object_kind *poVar1;
  _Bool _Var2;
  wchar_t wVar3;
  object *obj;
  long lVar4;
  ulong uVar5;
  wchar_t tval;
  wchar_t art;
  char s [80];
  
  wVar3 = cmd_get_arg_number((command_conflict *)cmd,"tval",&tval);
  if (wVar3 != L'\0') {
    s[0x40] = '\0';
    s[0x41] = '\0';
    s[0x42] = '\0';
    s[0x43] = '\0';
    s[0x44] = '\0';
    s[0x45] = '\0';
    s[0x46] = '\0';
    s[0x47] = '\0';
    s[0x48] = '\0';
    s[0x49] = '\0';
    s[0x4a] = '\0';
    s[0x4b] = '\0';
    s[0x4c] = '\0';
    s[0x4d] = '\0';
    s[0x4e] = '\0';
    s[0x4f] = '\0';
    s[0x30] = '\0';
    s[0x31] = '\0';
    s[0x32] = '\0';
    s[0x33] = '\0';
    s[0x34] = '\0';
    s[0x35] = '\0';
    s[0x36] = '\0';
    s[0x37] = '\0';
    s[0x38] = '\0';
    s[0x39] = '\0';
    s[0x3a] = '\0';
    s[0x3b] = '\0';
    s[0x3c] = '\0';
    s[0x3d] = '\0';
    s[0x3e] = '\0';
    s[0x3f] = '\0';
    s[0x20] = '\0';
    s[0x21] = '\0';
    s[0x22] = '\0';
    s[0x23] = '\0';
    s[0x24] = '\0';
    s[0x25] = '\0';
    s[0x26] = '\0';
    s[0x27] = '\0';
    s[0x28] = '\0';
    s[0x29] = '\0';
    s[0x2a] = '\0';
    s[0x2b] = '\0';
    s[0x2c] = '\0';
    s[0x2d] = '\0';
    s[0x2e] = '\0';
    s[0x2f] = '\0';
    s[0x10] = '\0';
    s[0x11] = '\0';
    s[0x12] = '\0';
    s[0x13] = '\0';
    s[0x14] = '\0';
    s[0x15] = '\0';
    s[0x16] = '\0';
    s[0x17] = '\0';
    s[0x18] = '\0';
    s[0x19] = '\0';
    s[0x1a] = '\0';
    s[0x1b] = '\0';
    s[0x1c] = '\0';
    s[0x1d] = '\0';
    s[0x1e] = '\0';
    s[0x1f] = '\0';
    s[0] = '\0';
    s[1] = '\0';
    s[2] = '\0';
    s[3] = '\0';
    s[4] = '\0';
    s[5] = '\0';
    s[6] = '\0';
    s[7] = '\0';
    s[8] = '\0';
    s[9] = '\0';
    s[10] = '\0';
    s[0xb] = '\0';
    s[0xc] = '\0';
    s[0xd] = '\0';
    s[0xe] = '\0';
    s[0xf] = '\0';
    strnfmt((char *)&art,0x50,"Create all items of which tval (1-%d)? ",0x23);
    _Var2 = get_string((char *)&art,s,0x50);
    if (!_Var2) {
      return;
    }
    _Var2 = get_int_from_string(s,&tval);
    if (0x22 < (uint)(tval + L'\xffffffff') || !_Var2) {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"tval",tval);
  }
  wVar3 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&art);
  if (wVar3 != L'\0') {
    _Var2 = get_check("Create instant artifacts? ");
    art = (wchar_t)_Var2;
    cmd_set_arg_choice((command_conflict *)cmd,"choice",art);
  }
  lVar4 = 0;
  for (uVar5 = 0; poVar1 = k_info, uVar5 < z_info->k_max; uVar5 = uVar5 + 1) {
    if ((*(wchar_t *)(k_info->flags + lVar4 + -0x5c) == tval) &&
       ((art != L'\0' ||
        (_Var2 = flag_has_dbg(k_info->kind_flags + lVar4,4,0x12,"kind->kind_flags","KF_INSTA_ART"),
        !_Var2)))) {
      obj = wiz_create_object_from_kind((object_kind *)(poVar1->flags + lVar4 + -0x80));
      wiz_drop_object(obj);
    }
    lVar4 = lVar4 + 0x2c0;
  }
  return;
}

Assistant:

void do_cmd_wiz_create_all_obj_from_tval(struct command *cmd)
{
	int tval, art;
	int i;

	if (cmd_get_arg_number(cmd, "tval", &tval) != CMD_OK) {
		char prompt[80];
		char s[80] = "";

		strnfmt(prompt, sizeof(prompt),
			"Create all items of which tval (1-%d)? ", TV_MAX - 1);
		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &tval) || tval < 1 ||
			tval >= TV_MAX) return;
		cmd_set_arg_number(cmd, "tval", tval);
	}

	if (cmd_get_arg_choice(cmd, "choice", &art) != CMD_OK) {
		art = get_check("Create instant artifacts? ");
		cmd_set_arg_choice(cmd, "choice", art);
	}

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		struct object *obj;

		if (kind->tval != tval ||
			(!art && kf_has(kind->kind_flags, KF_INSTA_ART))) continue;

		obj = wiz_create_object_from_kind(kind);
		wiz_drop_object(obj);
	}
}